

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O2

hugeint_t duckdb::DecimalScaleDownCheckOperator::Operation<long,duckdb::hugeint_t>
                    (long input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  uint8_t in_R8B;
  undefined7 in_register_00000081;
  hugeint_t hVar2;
  string error;
  allocator local_a1;
  string local_a0;
  string local_80;
  string local_60 [32];
  string local_40;
  
  bVar1 = CanScaleDownDecimal<long>(input,(DecimalScaleInput<long,_long> *)dataptr);
  if (bVar1) {
    hVar2 = DecimalScaleDownOperator::Operation<long,duckdb::hugeint_t>(input,mask,idx,dataptr);
    return hVar2;
  }
  ::std::__cxx11::string::string
            (local_60,"Casting value \"%s\" to type %s failed: value is out of range!",&local_a1);
  Decimal::ToString_abi_cxx11_
            (&local_80,(Decimal *)input,(ulong)*(byte *)((long)dataptr + 0x30),
             *(uint8_t *)((long)dataptr + 0x31),in_R8B);
  LogicalType::ToString_abi_cxx11_(&local_a0,(LogicalType *)(*dataptr + 8));
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
            (&local_40,(StringUtil *)local_60,&local_80,&local_a0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT71(in_register_00000081,in_R8B));
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string(local_60);
  hVar2 = HandleVectorCastError::Operation<duckdb::hugeint_t>
                    (&local_40,mask,idx,(VectorTryCastData *)((long)dataptr + 8));
  ::std::__cxx11::string::~string((string *)&local_40);
  return hVar2;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = static_cast<DecimalScaleInput<INPUT_TYPE> *>(dataptr);
		if (!CanScaleDownDecimal(input, *data)) {
			auto error = StringUtil::Format("Casting value \"%s\" to type %s failed: value is out of range!",
			                                Decimal::ToString(input, data->source_width, data->source_scale),
			                                data->result.GetType().ToString());
			return HandleVectorCastError::Operation<RESULT_TYPE>(std::move(error), mask, idx, data->vector_cast_data);
		}
		return DecimalScaleDownOperator::Operation<INPUT_TYPE, RESULT_TYPE>(input, mask, idx, dataptr);
	}